

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaInfo::addSchemaInfo(SchemaInfo *this,SchemaInfo *toAdd,ListType aListType)

{
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar1;
  XMLSize_t XVar2;
  bool bVar3;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *pBVar4;
  SchemaInfo *pSVar5;
  XMLSize_t i;
  XMLSize_t XVar6;
  
  if (aListType == IMPORT) {
    pBVar4 = &this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
    if (pBVar4 == (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pBVar4 = (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::SchemaInfo>::RefVectorOf
                ((RefVectorOf<xercesc_4_0::SchemaInfo> *)pBVar4,4,false,this->fMemoryManager);
      this->fImportedInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)pBVar4;
    }
    bVar3 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement(pBVar4,toAdd);
    if (!bVar3) {
      BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement
                (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,toAdd);
      updateImportingInfo(toAdd,this);
      return;
    }
  }
  else {
    pBVar4 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
    if (pBVar4 == (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pBVar4 = (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::SchemaInfo>::RefVectorOf
                ((RefVectorOf<xercesc_4_0::SchemaInfo> *)pBVar4,8,false,this->fMemoryManager);
      this->fIncludeInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)pBVar4;
      this->fAdoptInclude = true;
    }
    bVar3 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement(pBVar4,toAdd);
    if (!bVar3) {
      BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement
                (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,toAdd);
      pRVar1 = toAdd->fIncludeInfoList;
      if (pRVar1 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
        toAdd->fIncludeInfoList = this->fIncludeInfoList;
      }
      else if (pRVar1 != this->fIncludeInfoList) {
        XVar2 = (pRVar1->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
        for (XVar6 = 0;
            pBVar4 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,
            XVar2 != XVar6; XVar6 = XVar6 + 1) {
          pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                             (&toAdd->fIncludeInfoList->
                               super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar6);
          bVar3 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement(pBVar4,pSVar5);
          if (!bVar3) {
            pBVar4 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
            pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                               (&toAdd->fIncludeInfoList->
                                 super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar6);
            BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement(pBVar4,pSVar5);
          }
        }
        XVar2 = pBVar4->fCurCount;
        for (XVar6 = 0; XVar2 != XVar6; XVar6 = XVar6 + 1) {
          pBVar4 = &toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
          pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                             (&this->fIncludeInfoList->
                               super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar6);
          bVar3 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement(pBVar4,pSVar5);
          if (!bVar3) {
            pBVar4 = &toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
            pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                               (&this->fIncludeInfoList->
                                 super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar6);
            BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement(pBVar4,pSVar5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void SchemaInfo::addSchemaInfo(SchemaInfo* const toAdd,
                                      const ListType aListType) {

    if (aListType == IMPORT) {

        if (!fImportedInfoList)
            fImportedInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(4, false, fMemoryManager);

        if (!fImportedInfoList->containsElement(toAdd)) {

            fImportedInfoList->addElement(toAdd);
            toAdd->updateImportingInfo(this);
        }
    }
    else {

        if (!fIncludeInfoList) {

            fIncludeInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(8, false, fMemoryManager);
            fAdoptInclude = true;
        }

        if (!fIncludeInfoList->containsElement(toAdd)) {

		    fIncludeInfoList->addElement(toAdd);
            //code was originally:
            //toAdd->fIncludeInfoList = fIncludeInfoList;
            //however for handling multiple imports this was causing
            //to schemaInfo's to have the same fIncludeInfoList which they
            //both owned so when it was deleted it crashed.
			if (toAdd->fIncludeInfoList) {
			   if (toAdd->fIncludeInfoList != fIncludeInfoList) {
                   XMLSize_t size = toAdd->fIncludeInfoList->size();
                   for (XMLSize_t i=0; i<size; i++) {
                       if (!fIncludeInfoList->containsElement(toAdd->fIncludeInfoList->elementAt(i))) {
                            fIncludeInfoList->addElement(toAdd->fIncludeInfoList->elementAt(i));
                       }
                   }
                   size = fIncludeInfoList->size();
                   for (XMLSize_t j=0; j<size; j++) {
                       if (!toAdd->fIncludeInfoList->containsElement(fIncludeInfoList->elementAt(j))) {
                            toAdd->fIncludeInfoList->addElement(fIncludeInfoList->elementAt(j));
                       }
                   }
			   }
			}
			else {
				toAdd->fIncludeInfoList = fIncludeInfoList;
			}
        }
    }
}